

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

PClassActor * FState::StaticFindStateOwner(FState *state)

{
  PClassActor *pPVar1;
  bool bVar2;
  TArray<PClassActor_*,_PClassActor_*> *pTVar3;
  ulong uVar4;
  
  pTVar3 = &PClassActor::AllActorClasses;
  if ((ulong)PClassActor::AllActorClasses.Count != 0) {
    uVar4 = 0;
    do {
      pPVar1 = PClassActor::AllActorClasses.Array[uVar4];
      if ((state < pPVar1->OwnedStates) || (pPVar1->OwnedStates + pPVar1->NumOwnedStates <= state))
      {
        bVar2 = true;
      }
      else {
        bVar2 = false;
        pTVar3 = (TArray<PClassActor_*,_PClassActor_*> *)pPVar1;
      }
      if (!bVar2) {
        return (PClassActor *)pTVar3;
      }
      uVar4 = uVar4 + 1;
    } while (PClassActor::AllActorClasses.Count != uVar4);
  }
  return (PClassActor *)0x0;
}

Assistant:

PClassActor *FState::StaticFindStateOwner (const FState *state)
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		PClassActor *info = PClassActor::AllActorClasses[i];
		if (state >= info->OwnedStates &&
			state <  info->OwnedStates + info->NumOwnedStates)
		{
			return info;
		}
	}

	return NULL;
}